

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initRootFiles(VcprojGenerator *this)

{
  ProStringList *fileList;
  long in_RDI;
  long in_FS_OFFSET;
  ProKey *in_stack_ffffffffffffff98;
  QMakeProject *this_00;
  VCFilter *this_01;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  fileList = (ProStringList *)(in_RDI + 0x10c8);
  this_00 = *(QMakeProject **)(in_RDI + 0xd8);
  this_01 = (VCFilter *)&stack0xffffffffffffffc8;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffff98);
  QMakeProject::values(this_00,in_stack_ffffffffffffff98);
  VCFilter::addFiles(this_01,fileList);
  ProKey::~ProKey((ProKey *)0x29275c);
  *(long *)(in_RDI + 0x1118) = in_RDI;
  *(long *)(in_RDI + 0x1120) = in_RDI + 0x268;
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initRootFiles()
{
    // Note: Root files do _not_ have any filter name, filter nor GUID!
    vcProject.RootFiles.addFiles(project->values("RC_FILE"));

    vcProject.RootFiles.Project = this;
    vcProject.RootFiles.Config = &(vcProject.Configuration);
}